

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
               (void)

{
  _List_node_base *__args;
  uint *__args_1;
  pointer puVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  undefined1 *puVar5;
  _List_node_base *p_Var6;
  undefined4 local_730 [2];
  undefined8 local_728;
  shared_count sStack_720;
  undefined8 local_718;
  uint local_710 [2];
  undefined8 *local_708;
  char **local_700;
  char *local_6f8;
  char *local_6f0;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  undefined1 *local_3c0;
  undefined1 *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  m;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>>
            ();
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>::
  Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>
              *)&m,&columns,5);
  puVar1 = columns.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[5].
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (columns.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[5].
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    columns.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[5].
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar1;
  }
  test_content_equality<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>
            (&columns,&m);
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars1._M_t._M_impl.super__Rb_tree_header._M_header;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars2._M_t._M_impl.super__Rb_tree_header._M_header;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars2._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &bars3._M_t._M_impl.super__Rb_tree_header._M_header;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  bars3._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars3._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       bars2._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var6 = m.matrix_.super_RU_vine_swap_option.super_type.barcode_.
                super__List_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl._M_node.super__List_node_base._M_next;
      p_Var2 = bars1._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
      p_Var6 != (_List_node_base *)&m.matrix_.super_RU_vine_swap_option.super_type.barcode_;
      p_Var6 = p_Var6->_M_next) {
    __args = p_Var6 + 1;
    __args_1 = (uint *)((long)&p_Var6[1]._M_next + 4);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars1,(int *)__args,__args_1,(uint *)&p_Var6[1]._M_prev);
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int_const&,unsigned_int_const&,unsigned_int_const&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars2,(int *)__args,__args_1,(uint *)&p_Var6[1]._M_prev);
    local_710[0] = *(uint *)&p_Var6[1]._M_prev;
    local_718 = (undefined **)__args->_M_next;
    std::
    _Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
    ::_M_emplace_unique<int&,unsigned_int&,unsigned_int&>
              ((_Rb_tree<std::tuple<int,int,int>,std::tuple<int,int,int>,std::_Identity<std::tuple<int,int,int>>,test_barcode<Gudhi::persistence_matrix::Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,true,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                *)&bars3,(int *)&local_718,(uint *)((long)&local_718 + 4),local_710);
  }
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2f0,0x574);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_308 = "";
  local_730[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_310,0x574,1,2,&p_Var2[1]._M_parent,"std::get<0>(*it)",local_730,"0");
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_320,0x575);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_338 = "";
  local_730[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_340,0x575,1,2,&p_Var2[1].field_0x4,"std::get<1>(*it)",local_730,"0");
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_350,0x577);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_368 = "";
  local_730[0] = 0xffffffff;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_370,0x577,1,2,p_Var2 + 1,"std::get<2>(*it)",local_730,"-1");
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_380,0x579);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_398 = "";
  local_730[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_3a0,0x579,1,2,&p_Var4[1]._M_parent,"std::get<0>(*it)",local_730,"0");
  local_3b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a8 = "";
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3b0,0x57a);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_3d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c8 = "";
  local_730[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_3d0,0x57a,1,2,&p_Var4[1].field_0x4,"std::get<1>(*it)",local_730,"1");
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3e0,0x57b);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f8 = "";
  local_730[0] = 3;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_400,0x57b,1,2,p_Var4 + 1,"std::get<2>(*it)",local_730,"3");
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_410,0x57d);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_428 = "";
  local_730[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_430,0x57d,1,2,&p_Var4[1]._M_parent,"std::get<0>(*it)",local_730,"0");
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_440,0x57e);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_458 = "";
  local_730[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_460,0x57e,1,2,&p_Var4[1].field_0x4,"std::get<1>(*it)",local_730,"2");
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_470,0x57f);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_488 = "";
  local_730[0] = 4;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_490,0x57f,1,2,p_Var4 + 1,"std::get<2>(*it)",local_730,"4");
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4a0,0x581);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4b8 = "";
  local_730[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_4c0,0x581,1,2,&p_Var4[1]._M_parent,"std::get<0>(*it)",local_730,"0");
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_4d0,0x582);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4e8 = "";
  local_730[0] = 7;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_4f0,0x582,1,2,&p_Var4[1].field_0x4,"std::get<1>(*it)",local_730,"7");
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_500,0x583);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_518 = "";
  local_730[0] = 8;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_520,0x583,1,2,p_Var4 + 1,"std::get<2>(*it)",local_730,"8");
  p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_530,0x585);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_548 = "";
  local_730[0] = 1;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_550,0x585,1,2,&p_Var4[1]._M_parent,"std::get<0>(*it)",local_730,"1");
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_560,0x586);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_578 = "";
  local_730[0] = 5;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_580,0x586,1,2,&p_Var4[1].field_0x4,"std::get<1>(*it)",local_730,"5");
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_590,0x587);
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204240;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = (char **)0x1a326a;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5a8 = "";
  local_730[0] = 6;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_718,&local_5b0,0x587,1,2,p_Var4 + 1,"std::get<2>(*it)",local_730,"6");
  puVar5 = (undefined1 *)std::_Rb_tree_increment(p_Var4);
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5c0,0x589);
  local_728 = 0;
  sStack_720.pi_ = (sp_counted_base *)0x0;
  local_6f8 = "it == bars1.end()";
  local_6f0 = "";
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204380;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5d8 = "";
  local_700 = &local_6f8;
  local_730[0]._0_1_ = (_Rb_tree_header *)puVar5 == &bars1._M_t._M_impl.super__Rb_tree_header;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_720);
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_5f0,0x58b);
  local_730[0]._0_1_ = std::operator==(&bars1._M_t,&bars2._M_t);
  local_728 = 0;
  sStack_720.pi_ = (sp_counted_base *)0x0;
  local_6f8 = "bars1 == bars2";
  local_6f0 = "";
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204380;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_608 = "";
  local_700 = &local_6f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_720);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_618 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_620,0x58c);
  bVar3 = std::operator==(&bars1._M_t,&bars3._M_t);
  local_730[0] = CONCAT31(local_730[0]._1_3_,bVar3);
  local_728 = 0;
  sStack_720.pi_ = (sp_counted_base *)0x0;
  local_6f8 = "bars1 == bars3";
  local_6f0 = "";
  local_710[0] = local_710[0] & 0xffffff00;
  local_718 = &PTR__lazy_ostream_00204380;
  local_708 = &boost::unit_test::lazy_ostream::inst;
  local_700 = &local_6f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_720);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars3._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars2._M_t);
  std::
  _Rb_tree<std::tuple<int,_int,_int>,_std::tuple<int,_int,_int>,_std::_Identity<std::tuple<int,_int,_int>_>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
  ::~_Rb_tree(&bars1._M_t);
  Gudhi::persistence_matrix::
  Matrix<RU_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_true,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&columns);
  return;
}

Assistant:

void test_barcode() {
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns, 5);

  const auto& barcode = m.get_current_barcode();

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    columns[5].clear();
  } else {
    columns = build_longer_chain_matrix<typename Matrix::Column>();
  }
  test_content_equality(columns, m);

  if constexpr (Matrix::Option_list::has_row_access) {
    std::vector<witness_content<typename Matrix::Column> > rows;
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      rows = build_longer_reduced_row_matrix<typename Matrix::Column>();
    } else {
      rows = build_longer_chain_row_matrix<typename Matrix::Column>();
    }
    unsigned int i = 0;
    for (auto& r : rows) {
      if constexpr (Matrix::Option_list::has_removable_rows)
        if (i == 6) continue;
      test_column_equality<typename Matrix::Column>(r, get_ordered_row(m, i++));
    }
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  // TODO: verify why this -1 works...: it->death should be unsigned int, so double conversion
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 3);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 4);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 7);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 6);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}